

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O1

void __thiscall
spdlog::details::full_formatter::format(full_formatter *this,log_msg *msg,tm *tm_time)

{
  MemoryWriter *this_00;
  Buffer<char> *pBVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  char *str_1;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_00;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_01;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_02;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_03;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_04;
  
  lVar6 = (msg->time).__d.__r;
  this_00 = &msg->formatted;
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '[';
  uVar5 = tm_time->tm_year + 0x76c;
  fmt::BasicWriter<char>::
  write_int<unsigned_int,fmt::IntFormatSpec<unsigned_int,fmt::TypeSpec<(char)0>,char>>
            (&this_00->super_BasicWriter<char>,uVar5,
             (IntFormatSpec<unsigned_int,_fmt::TypeSpec<__x00_>,_char>)uVar5);
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '-';
  uVar5 = tm_time->tm_mon + 1;
  spec._8_8_ = (ulong)uVar5 << 0x20;
  spec.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  fmt::BasicWriter<char>::
  write_int<unsigned_int,fmt::IntFormatSpec<unsigned_int,fmt::AlignTypeSpec<(char)0>,char>>
            (&this_00->super_BasicWriter<char>,uVar5,spec);
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '-';
  spec_00._8_8_ = (ulong)(uint)tm_time->tm_mday << 0x20;
  spec_00.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_00.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  fmt::BasicWriter<char>::
  write_int<unsigned_int,fmt::IntFormatSpec<unsigned_int,fmt::AlignTypeSpec<(char)0>,char>>
            (&this_00->super_BasicWriter<char>,tm_time->tm_mday,spec_00);
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ' ';
  spec_01._8_8_ = (ulong)(uint)tm_time->tm_hour << 0x20;
  spec_01.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_01.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  fmt::BasicWriter<char>::
  write_int<unsigned_int,fmt::IntFormatSpec<unsigned_int,fmt::AlignTypeSpec<(char)0>,char>>
            (&this_00->super_BasicWriter<char>,tm_time->tm_hour,spec_01);
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ':';
  spec_02._8_8_ = (ulong)(uint)tm_time->tm_min << 0x20;
  spec_02.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_02.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  fmt::BasicWriter<char>::
  write_int<unsigned_int,fmt::IntFormatSpec<unsigned_int,fmt::AlignTypeSpec<(char)0>,char>>
            (&this_00->super_BasicWriter<char>,tm_time->tm_min,spec_02);
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  lVar6 = (lVar6 / 1000000) % 1000;
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ':';
  spec_03._8_8_ = (ulong)(uint)tm_time->tm_sec << 0x20;
  spec_03.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_03.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  fmt::BasicWriter<char>::
  write_int<unsigned_int,fmt::IntFormatSpec<unsigned_int,fmt::AlignTypeSpec<(char)0>,char>>
            (&this_00->super_BasicWriter<char>,tm_time->tm_sec,spec_03);
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '.';
  spec_04._8_8_ = lVar6 << 0x20;
  spec_04.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 3;
  spec_04.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  fmt::BasicWriter<char>::
  write_int<unsigned_int,fmt::IntFormatSpec<unsigned_int,fmt::AlignTypeSpec<(char)0>,char>>
            (&this_00->super_BasicWriter<char>,(uint)lVar6,spec_04);
  fmt::Buffer<char>::append<char>((msg->formatted).super_BasicWriter<char>.buffer_,"] ","");
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '[';
  pcVar3 = (msg->logger_name->_M_dataplus)._M_p;
  fmt::Buffer<char>::append<char>
            ((msg->formatted).super_BasicWriter<char>.buffer_,pcVar3,
             pcVar3 + msg->logger_name->_M_string_length);
  fmt::Buffer<char>::append<char>((msg->formatted).super_BasicWriter<char>.buffer_,"] ","");
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '[';
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  msg->color_range_start = pBVar1->size_;
  pcVar3 = *(char **)(level::level_names + (ulong)msg->level * 8);
  sVar4 = strlen(pcVar3);
  fmt::Buffer<char>::append<char>(pBVar1,pcVar3,pcVar3 + sVar4);
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  msg->color_range_end = pBVar1->size_;
  fmt::Buffer<char>::append<char>(pBVar1,"] ","");
  pBVar1 = (msg->raw).super_BasicWriter<char>.buffer_;
  pcVar3 = pBVar1->ptr_;
  fmt::Buffer<char>::append<char>
            ((msg->formatted).super_BasicWriter<char>.buffer_,pcVar3,pcVar3 + pBVar1->size_);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
#ifndef SPDLOG_NO_DATETIME
        auto duration = msg.time.time_since_epoch();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(duration).count() % 1000;

        /* Slower version(while still very fast - about 3.2 million lines/sec under 10 threads),
        msg.formatted.write("[{:d}-{:02d}-{:02d} {:02d}:{:02d}:{:02d}.{:03d}] [{}] [{}] {} ",
        tm_time.tm_year + 1900,
        tm_time.tm_mon + 1,
        tm_time.tm_mday,
        tm_time.tm_hour,
        tm_time.tm_min,
        tm_time.tm_sec,
        static_cast<int>(millis),
        msg.logger_name,
        level::to_str(msg.level),
        msg.raw.str());*/

        // Faster (albeit uglier) way to format the line (5.6 million lines/sec under 10 threads)
        msg.formatted << '[' << static_cast<unsigned int>(tm_time.tm_year + 1900) << '-'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_mon + 1), 2, '0') << '-'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_mday), 2, '0') << ' '
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_hour), 2, '0') << ':'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_min), 2, '0') << ':'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_sec), 2, '0') << '.'
                      << fmt::pad(static_cast<unsigned int>(millis), 3, '0') << "] ";

        // no datetime needed
#else
        (void)tm_time;
#endif

#ifndef SPDLOG_NO_NAME
        msg.formatted << '[' << *msg.logger_name << "] ";
#endif

        msg.formatted << '[';
        // wrap the level name with color
        msg.color_range_start = msg.formatted.size();
        msg.formatted << level::to_str(msg.level);
        msg.color_range_end = msg.formatted.size();
        msg.formatted << "] " << fmt::StringRef(msg.raw.data(), msg.raw.size());
    }